

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  undefined1 (*pauVar9) [16];
  float fVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  __m128 afVar21;
  binary_op_pow_pack4 op;
  __m128 _b;
  binary_op_pow_pack4 local_6d;
  int local_6c;
  Mat *local_68;
  long local_60;
  float local_58 [2];
  float afStack_50 [2];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  p_Var2 = this->_vptr_BinaryOp_x86[-3];
  if (bottom_top_blob->elempack != 4) {
switchD_0023c54a_default:
    iVar5 = BinaryOp::forward_inplace
                      ((BinaryOp *)((long)&this->_vptr_BinaryOp_x86 + (long)p_Var2),bottom_top_blob,
                       opt);
    return iVar5;
  }
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
  case 0:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar10 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar9 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          iVar8 = iVar7;
          do {
            auVar11._0_4_ = *(float *)*pauVar9 + fVar10;
            auVar11._4_4_ = *(float *)((long)*pauVar9 + 4) + fVar10;
            auVar11._8_4_ = *(float *)((long)*pauVar9 + 8) + fVar10;
            auVar11._12_4_ = *(float *)((long)*pauVar9 + 0xc) + fVar10;
            *pauVar9 = auVar11;
            pauVar9 = pauVar9 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 1:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar10 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar9 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          iVar8 = iVar7;
          do {
            auVar14._0_4_ = *(float *)*pauVar9 - fVar10;
            auVar14._4_4_ = *(float *)((long)*pauVar9 + 4) - fVar10;
            auVar14._8_4_ = *(float *)((long)*pauVar9 + 8) - fVar10;
            auVar14._12_4_ = *(float *)((long)*pauVar9 + 0xc) - fVar10;
            *pauVar9 = auVar14;
            pauVar9 = pauVar9 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 2:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar10 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar9 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          iVar8 = iVar7;
          do {
            auVar12._0_4_ = *(float *)*pauVar9 * fVar10;
            auVar12._4_4_ = *(float *)((long)*pauVar9 + 4) * fVar10;
            auVar12._8_4_ = *(float *)((long)*pauVar9 + 8) * fVar10;
            auVar12._12_4_ = *(float *)((long)*pauVar9 + 0xc) * fVar10;
            *pauVar9 = auVar12;
            pauVar9 = pauVar9 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 3:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar10 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar9 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          iVar8 = iVar7;
          do {
            auVar13._0_4_ = *(float *)*pauVar9 * fVar10;
            auVar13._4_4_ = *(float *)((long)*pauVar9 + 4) * fVar10;
            auVar13._8_4_ = *(float *)((long)*pauVar9 + 8) * fVar10;
            auVar13._12_4_ = *(float *)((long)*pauVar9 + 0xc) * fVar10;
            *pauVar9 = auVar13;
            pauVar9 = pauVar9 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 4:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar9 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          iVar8 = iVar7;
          do {
            auVar4._4_4_ = uVar1;
            auVar4._0_4_ = uVar1;
            auVar4._8_4_ = uVar1;
            auVar4._12_4_ = uVar1;
            auVar15 = maxps(*pauVar9,auVar4);
            *pauVar9 = auVar15;
            pauVar9 = pauVar9 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 5:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar9 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          iVar8 = iVar7;
          do {
            auVar3._4_4_ = uVar1;
            auVar3._0_4_ = uVar1;
            auVar3._8_4_ = uVar1;
            auVar3._12_4_ = uVar1;
            auVar15 = minps(*pauVar9,auVar3);
            *pauVar9 = auVar15;
            pauVar9 = pauVar9 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 6:
    local_48 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    local_6c = bottom_top_blob->h * bottom_top_blob->w;
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      lVar6 = 0;
      local_68 = bottom_top_blob;
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      do {
        if (0 < local_6c) {
          pauVar9 = (undefined1 (*) [16])
                    (local_68->cstep * lVar6 * local_68->elemsize + (long)local_68->data);
          iVar5 = local_6c;
          do {
            local_58 = *(float (*) [2])*pauVar9;
            afStack_50 = *(float (*) [2])(*pauVar9 + 8);
            afVar21 = binary_op_pow_pack4::operator()
                                (&local_6d,(__m128 *)local_58,(__m128 *)&local_48);
            auVar15._8_4_ = extraout_XMM0_Dc;
            auVar15._0_8_ = afVar21._0_8_;
            auVar15._12_4_ = extraout_XMM0_Dd;
            *pauVar9 = auVar15;
            pauVar9 = pauVar9 + 1;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != local_60);
    }
    break;
  case 7:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar10 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar9 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          iVar8 = iVar7;
          do {
            auVar15 = *pauVar9;
            auVar16._0_4_ = fVar10 - auVar15._0_4_;
            auVar16._4_4_ = fVar10 - auVar15._4_4_;
            auVar16._8_4_ = fVar10 - auVar15._8_4_;
            auVar16._12_4_ = fVar10 - auVar15._12_4_;
            *pauVar9 = auVar16;
            pauVar9 = pauVar9 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 8:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar10 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar9 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          iVar8 = iVar7;
          do {
            auVar15 = *pauVar9;
            in_XMM2 = rcpps(in_XMM2,auVar15);
            fVar17 = fVar10 * in_XMM2._0_4_;
            fVar18 = fVar10 * in_XMM2._4_4_;
            fVar19 = fVar10 * in_XMM2._8_4_;
            fVar20 = fVar10 * in_XMM2._12_4_;
            *(float *)*pauVar9 = (fVar10 - auVar15._0_4_ * fVar17) * in_XMM2._0_4_ + fVar17;
            *(float *)(*pauVar9 + 4) = (fVar10 - auVar15._4_4_ * fVar18) * in_XMM2._4_4_ + fVar18;
            *(float *)(*pauVar9 + 8) = (fVar10 - auVar15._8_4_ * fVar19) * in_XMM2._8_4_ + fVar19;
            *(float *)(*pauVar9 + 0xc) =
                 (fVar10 - auVar15._12_4_ * fVar20) * in_XMM2._12_4_ + fVar20;
            pauVar9 = pauVar9 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  default:
    goto switchD_0023c54a_default;
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}